

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O2

string * std::format<unsigned_short&>
                   (string *__return_storage_ptr__,string_view fmt,unsigned_short *ts)

{
  char *pcVar1;
  ulong uVar2;
  ostream *this;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  size_t asStack_3c0 [2];
  char *local_3b0;
  long alStack_3a8 [62];
  stringstream ss;
  ostream local_1a8 [376];
  
  pcVar5 = fmt._M_str;
  asStack_3c0[0] = 0x1172c1;
  memset(asStack_3c0 + 1,0,0x200);
  uVar2 = 0;
  pcVar4 = pcVar5;
  for (sVar6 = 0; fmt._M_len != sVar6; sVar6 = sVar6 + 1) {
    pcVar1 = pcVar5 + sVar6;
    pcVar3 = pcVar1;
    if ((*pcVar1 != '}') && (pcVar3 = pcVar4, *pcVar1 == '{')) {
      if (pcVar4 == pcVar5) {
        asStack_3c0[uVar2 * 2 + 1] = sVar6;
        (&local_3b0)[uVar2 * 2] = pcVar5;
        uVar2 = uVar2 + 1;
        pcVar3 = pcVar5;
      }
      else if (uVar2 < 0x20 && pcVar1 != pcVar4) {
        asStack_3c0[uVar2 * 2 + 1] = (size_t)(pcVar5 + ((sVar6 - 1) - (long)pcVar4));
        (&local_3b0)[uVar2 * 2] = pcVar4 + 1;
        uVar2 = uVar2 + 1;
      }
    }
    pcVar4 = pcVar3;
  }
  pcVar4 = pcVar4 + 1;
  if (pcVar4 != pcVar5 + fmt._M_len) {
    asStack_3c0[uVar2 * 2 + 1] = (long)(pcVar5 + fmt._M_len) - (long)pcVar4;
    (&local_3b0)[uVar2 * 2] = pcVar4;
  }
  asStack_3c0[0] = 0x117364;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  asStack_3c0[0] = 0x11737d;
  this = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,asStack_3c0[1]);
  asStack_3c0[0] = 0x117389;
  std::ostream::operator<<(this,*ts);
  for (lVar7 = 0x18; lVar7 != 0x208; lVar7 = lVar7 + 0x10) {
    asStack_3c0[0] = 0x1173ab;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)asStack_3c0 + lVar7 + 8U),
               *(long *)((long)asStack_3c0 + lVar7));
  }
  asStack_3c0[0] = 0x1173bd;
  std::__cxx11::stringbuf::str();
  asStack_3c0[0] = 0x1173ca;
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}